

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O3

long scatter(int sx,int sy,int blastforce,uint scflags,obj *obj)

{
  byte bVar1;
  level *lev;
  monst *mtmp;
  char cVar2;
  char cVar3;
  undefined8 *puVar4;
  boolean bVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  level **pplVar10;
  obj *obj_00;
  char *pcVar11;
  undefined8 *puVar12;
  trap *trap;
  char cVar13;
  obj *obj_01;
  long lVar14;
  int iVar15;
  obj *poVar16;
  undefined8 *__ptr;
  obj *poVar17;
  bool bVar18;
  obj *in_stack_ffffffffffffff88;
  xchar local_6c;
  undefined8 *local_48;
  xchar local_40;
  
  pplVar10 = &obj->olev;
  if (obj == (obj *)0x0) {
    pplVar10 = &level;
  }
  lev = *pplVar10;
  if (lev == level) {
    bVar18 = (viz_array[sy][sx] & 2U) == 0;
  }
  else {
    bVar18 = true;
  }
  iVar15 = 0;
  poVar16 = obj;
  puVar12 = (undefined8 *)0x0;
  puVar4 = (undefined8 *)0x0;
LAB_0019cee5:
  while( true ) {
    __ptr = puVar4;
    local_48 = puVar12;
    obj_01 = poVar16;
    if (obj == (obj *)0x0) {
      obj_01 = lev->objects[sx][sy];
    }
    if (obj_01 == (obj *)0x0) break;
    uVar8 = obj_01->quan;
    if ((int)uVar8 < 2) {
      poVar17 = (obj *)0x0;
      poVar16 = (obj *)0x0;
      obj_00 = obj_01;
    }
    else {
      if (0x7fff < uVar8) {
        uVar8 = 0x8000;
      }
      uVar7 = mt_random();
      obj_00 = splitobj(obj_01,(ulong)(uVar7 % (uVar8 - 1) + 1));
      poVar17 = obj_01;
    }
    obj_extract_self(obj_00);
    puVar12 = local_48;
    puVar4 = __ptr;
    if ((((scflags & 0x10) != 0) && ((obj_00->otyp & 0xfffeU) == 0x214)) &&
       (uVar8 = mt_random(),
       0x19999999 < (uVar8 * -0x33333333 >> 1 | (uint)((uVar8 * -0x33333333 & 1) != 0) << 0x1f))) {
      if (obj_00->otyp == 0x214) goto code_r0x0019cf80;
      trap = t_at(lev,sx,sy);
      if ((trap != (trap *)0x0) && ((trap->field_0x8 & 0x1f) == 0x14)) {
        deltrap(lev,trap);
      }
      if (!bVar18) {
        pcVar11 = Tobjnam(obj_00,"crumble");
        pline("%s.",pcVar11);
      }
      break_statue(obj_00);
      goto LAB_0019d173;
    }
    local_6c = (xchar)sx;
    local_40 = (xchar)sy;
    if (((scflags & 8) == 0) ||
       ((((uVar8 = mt_random(),
          0x19999999 < (uVar8 * -0x33333333 >> 1 | (uint)((uVar8 * -0x33333333 & 1) != 0) << 0x1f)
          && ((long)obj_00->otyp != 0x10f)) &&
         ((*(ushort *)&objects[obj_00->otyp].field_0x11 & 0x1f0) != 0x130)) ||
        (iVar9 = breaks(obj_00,local_6c,local_40), iVar9 == 0)))) {
      puVar12 = (undefined8 *)malloc(0x28);
      *puVar12 = 0;
      puVar12[1] = obj_00;
      puVar12[2] = poVar17;
      *(xchar *)(puVar12 + 3) = local_6c;
      *(xchar *)((long)puVar12 + 0x19) = local_40;
      uVar8 = mt_random();
      *(schar *)((long)puVar12 + 0x1a) = xdir[uVar8 & 7];
      *(schar *)((long)puVar12 + 0x1b) = ""[uVar8 & 7];
      uVar8 = blastforce - obj_00->owt / 0x28;
      if ((int)uVar8 < 2) {
        uVar8 = 1;
      }
      uVar7 = mt_random();
      iVar9 = uVar7 % uVar8 + 1;
      if (iVar15 <= iVar9) {
        iVar15 = iVar9;
      }
      *(int *)((long)puVar12 + 0x1c) = iVar9;
      *(undefined1 *)(puVar12 + 4) = 0;
      puVar4 = puVar12;
      if (__ptr != (undefined8 *)0x0) {
        *local_48 = puVar12;
        puVar4 = __ptr;
      }
    }
  }
  puVar12 = __ptr;
  if (0 < iVar15) {
    do {
      for (; puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)*puVar12) {
        iVar9 = *(int *)((long)puVar12 + 0x1c);
        *(int *)((long)puVar12 + 0x1c) = iVar9 + -1;
        if ((0 < iVar9) && (*(char *)(puVar12 + 4) == '\0')) {
          cVar6 = *(char *)((long)puVar12 + 0x1a);
          bhitpos.x = cVar6 + *(char *)(puVar12 + 3);
          cVar13 = *(char *)((long)puVar12 + 0x1b);
          bhitpos.y = cVar13 + *(char *)((long)puVar12 + 0x19);
          cVar2 = *(char *)(puVar12 + 3);
          cVar3 = *(char *)((long)puVar12 + 0x19);
          if ((byte)(bhitpos.x - 1U) < 0x4f && (byte)bhitpos.y < 0x15) {
            if ((byte)lev->locations[(byte)bhitpos.x][(byte)bhitpos.y].typ < 0x11) {
LAB_0019d353:
              cVar2 = bhitpos.x - cVar6;
              cVar3 = bhitpos.y - cVar13;
              goto LAB_0019d369;
            }
            bVar5 = closed_door(lev,(int)bhitpos.x,(int)bhitpos.y);
            if (bVar5 != '\0') {
              cVar6 = *(char *)((long)puVar12 + 0x1a);
              cVar13 = *(char *)((long)puVar12 + 0x1b);
              goto LAB_0019d353;
            }
            mtmp = lev->monsters[bhitpos.x][bhitpos.y];
            if ((mtmp == (monst *)0x0) || ((mtmp->field_0x61 & 2) != 0)) {
              if ((bhitpos.x == u.ux) && (((scflags & 4) != 0 && (bhitpos.y == u.uy)))) {
                if (multi != 0) {
                  nomul(0,(char *)0x0);
                }
                bVar1 = (youmonst.data)->msize;
                cVar6 = ((obj *)puVar12[1])->spe;
                iVar9 = dmgval((monst *)0x0,(obj *)puVar12[1],'\x01',&youmonst);
                iVar9 = thitu(((int)cVar6 - (uint)(bVar1 < 3)) + 9,iVar9,(obj *)puVar12[1],
                              (obj *)puVar12[2],(monst *)0x0,(char *)0x0);
                if (iVar9 != 0) {
                  *(int *)((long)puVar12 + 0x1c) = *(int *)((long)puVar12 + 0x1c) + -3;
                  stop_occupation();
                }
              }
            }
            else if ((scflags & 2) != 0) {
              *(int *)((long)puVar12 + 0x1c) = *(int *)((long)puVar12 + 0x1c) + -1;
              iVar9 = ohitmon((monst *)0x0,mtmp,(obj *)puVar12[1],(obj *)puVar12[2],1,'\0');
              if (iVar9 != 0) {
                puVar12[1] = 0;
                cVar2 = bhitpos.x;
                cVar3 = bhitpos.y;
                goto LAB_0019d369;
              }
            }
          }
          else {
LAB_0019d369:
            bhitpos.y = cVar3;
            bhitpos.x = cVar2;
            *(undefined1 *)(puVar12 + 4) = 1;
          }
          *(xchar *)(puVar12 + 3) = bhitpos.x;
          *(xchar *)((long)puVar12 + 0x19) = bhitpos.y;
        }
      }
      bVar18 = 1 < iVar15;
      puVar12 = __ptr;
      iVar15 = iVar15 + -1;
    } while (bVar18);
  }
  lVar14 = 0;
  while (__ptr != (undefined8 *)0x0) {
    puVar12 = (undefined8 *)*__ptr;
    poVar16 = (obj *)__ptr[1];
    iVar15 = (int)*(char *)(__ptr + 3);
    iVar9 = (int)*(char *)((long)__ptr + 0x19);
    if (poVar16 != (obj *)0x0) {
      if (iVar9 != sy || iVar15 != sx) {
        lVar14 = lVar14 + poVar16->quan;
      }
      place_object(poVar16,lev,iVar15,iVar9);
      stackobj(in_stack_ffffffffffffff88);
    }
    free(__ptr);
    newsym(iVar15,iVar9);
    __ptr = puVar12;
  }
  newsym(sx,sy);
  return lVar14;
code_r0x0019cf80:
  if (!bVar18) {
    pcVar11 = Tobjnam(obj_00,"break");
    pline("%s apart.",pcVar11);
  }
  fracture_rock(obj_00);
  place_object(obj_00,lev,sx,sy);
  obj_00 = sobj_at(0x214,lev,sx,sy);
  if (obj_00 != (obj *)0x0) {
    obj_extract_self(obj_00);
LAB_0019d173:
    place_object(obj_00,lev,sx,sy);
  }
  goto LAB_0019cee5;
}

Assistant:

long scatter(int sx, int sy,	/* location of objects to scatter */
             int blastforce,	/* force behind the scattering	*/
             unsigned int scflags,
             struct obj *obj)	/* only scatter this obj        */
{
	struct obj *otmp;
	struct obj *ostack;
	struct level *lev = obj ? obj->olev : level;
	int tmp;
	int farthest = 0;
	uchar typ;
	long qtmp;
	boolean used_up;
	boolean individual_object = obj ? TRUE : FALSE;
	struct monst *mtmp;
	struct scatter_chain *stmp, *stmp2 = 0;
	struct scatter_chain *schain = NULL;
	long total = 0L;
	boolean visible = (lev == level && cansee(sx, sy));

	while ((otmp = individual_object ? obj : lev->objects[sx][sy]) != 0) {
	    if (otmp->quan > 1L) {
		qtmp = otmp->quan - 1;
		if (qtmp > LARGEST_INT) qtmp = LARGEST_INT;
		qtmp = (long)rnd((int)qtmp);
		ostack = otmp;
		otmp = splitobj(otmp, qtmp);
	    } else {
		ostack = NULL;
		obj = NULL; /* all used */
	    }
	    obj_extract_self(otmp);
	    used_up = FALSE;

	    /* 9 in 10 chance of fracturing boulders or statues */
	    if ((scflags & MAY_FRACTURE)
			&& ((otmp->otyp == BOULDER) || (otmp->otyp == STATUE))
			&& rn2(10)) {
		if (otmp->otyp == BOULDER) {
		    if (visible)
			pline("%s apart.", Tobjnam(otmp, "break"));
		    fracture_rock(otmp);
		    place_object(otmp, lev, sx, sy);
		    if ((otmp = sobj_at(BOULDER, lev, sx, sy)) != 0) {
			/* another boulder here, restack it to the top */
			obj_extract_self(otmp);
			place_object(otmp, lev, sx, sy);
		    }
		} else {
		    struct trap *trap;

		    if ((trap = t_at(lev, sx, sy)) && trap->ttyp == STATUE_TRAP)
			    deltrap(lev, trap);
		    if (visible)
			pline("%s.", Tobjnam(otmp, "crumble"));
		    break_statue(otmp);
		    place_object(otmp, lev, sx, sy);	/* put fragments on floor */
		}
		used_up = TRUE;

	    /* 1 in 10 chance of destruction of obj; glass, egg destruction */
	    } else if ((scflags & MAY_DESTROY) && (!rn2(10)
			|| (objects[otmp->otyp].oc_material == GLASS
			|| otmp->otyp == EGG))) {
		if (breaks(otmp, (xchar)sx, (xchar)sy)) used_up = TRUE;
	    }

	    if (!used_up) {
		stmp = malloc(sizeof(struct scatter_chain));
		stmp->next = NULL;
		stmp->obj = otmp;
		stmp->ostack = ostack;
		stmp->ox = sx;
		stmp->oy = sy;
		tmp = rn2(8);		/* get the direction */
		stmp->dx = xdir[tmp];
		stmp->dy = ydir[tmp];
		tmp = blastforce - (otmp->owt/40);
		if (tmp < 1) tmp = 1;
		stmp->range = rnd(tmp); /* anywhere up to that determ. by wt */
		if (farthest < stmp->range) farthest = stmp->range;
		stmp->stopped = FALSE;
		if (!schain)
		    schain = stmp;
		else
		    stmp2->next = stmp;
		stmp2 = stmp;
	    }
	}

	while (farthest-- > 0) {
		for (stmp = schain; stmp; stmp = stmp->next) {
		   if ((stmp->range-- > 0) && (!stmp->stopped)) {
			bhitpos.x = stmp->ox + stmp->dx;
			bhitpos.y = stmp->oy + stmp->dy;
			typ = lev->locations[bhitpos.x][bhitpos.y].typ;
			if (!isok(bhitpos.x, bhitpos.y)) {
				bhitpos.x -= stmp->dx;
				bhitpos.y -= stmp->dy;
				stmp->stopped = TRUE;
			} else if (!ZAP_POS(typ) ||
					closed_door(lev, bhitpos.x, bhitpos.y)) {
				bhitpos.x -= stmp->dx;
				bhitpos.y -= stmp->dy;
				stmp->stopped = TRUE;
			} else if ((mtmp = m_at(lev, bhitpos.x, bhitpos.y)) != 0) {
				if (scflags & MAY_HITMON) {
				    stmp->range--;
				    if (ohitmon(NULL, mtmp, stmp->obj,
						stmp->ostack, 1, FALSE)) {
					stmp->obj = NULL;
					stmp->stopped = TRUE;
				    }
				}
			} else if (bhitpos.x==u.ux && bhitpos.y==u.uy) {
				if (scflags & MAY_HITYOU) {
				    int hitvalu, hitu;

				    if (multi) nomul(0, NULL);
				    hitvalu = 8 + stmp->obj->spe;
				    if (bigmonst(youmonst.data)) hitvalu++;
				    hitu = thitu(hitvalu,
						 dmgval(NULL, stmp->obj, TRUE,
							&youmonst),
						 stmp->obj, stmp->ostack, NULL,
						 NULL);
				    if (hitu) {
					stmp->range -= 3;
					stop_occupation();
				    }
				}
			} else {
				if (scflags & VIS_EFFECTS) {
				    /* tmp_at(bhitpos.x, bhitpos.y); */
				    /* delay_output(); */
				}
			}
			stmp->ox = bhitpos.x;
			stmp->oy = bhitpos.y;
		   }
		}
	}
	for (stmp = schain; stmp; stmp = stmp2) {
		int x,y;

		stmp2 = stmp->next;
		x = stmp->ox; y = stmp->oy;
		if (stmp->obj) {
			if ( x!=sx || y!=sy )
			    total += stmp->obj->quan;
			place_object(stmp->obj, lev, x, y);
			stackobj(stmp->obj);
		}
		free(stmp);
		newsym(x,y);
	}
	newsym(sx,sy);

	return total;
}